

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThread.cpp
# Opt level: O1

void __thiscall IlmThread_2_5::Thread::~Thread(Thread *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Thread::~Thread ()
{
    // hopefully the thread has basically exited and we are just
    // cleaning up, because run is a virtual function, so the v-table
    // has already been partly destroyed...
    if ( _thread.joinable () )
        _thread.join ();
}